

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordinationNumber.cpp
# Opt level: O3

void __thiscall
OpenMD::CoordinationNumber::CoordinationNumber
          (CoordinationNumber *this,SimInfo *info,string *filename,string *sele1,string *sele2,
          RealType rCut,int bins)

{
  SelectionEvaluator *this_00;
  SelectionEvaluator *this_01;
  pointer pcVar1;
  int iVar2;
  long *plVar3;
  ostream *poVar4;
  long *plVar5;
  long lVar6;
  string paramString;
  stringstream params;
  string local_210;
  SelectionSet local_1f0;
  SelectionManager *local_1d8;
  string *local_1d0;
  SelectionManager *local_1c8;
  string *local_1c0;
  long *local_1b8;
  long local_1b0;
  long local_1a8;
  long lStack_1a0;
  ios_base local_138 [264];
  
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,bins);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser =
       (_func_int **)&PTR__CoordinationNumber_00336630;
  this->rCut_ = rCut;
  this->bins_ = bins;
  (this->sele1_)._M_dataplus._M_p = (pointer)&(this->sele1_).field_2;
  pcVar1 = (sele1->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->sele1_,pcVar1,pcVar1 + sele1->_M_string_length);
  local_1c8 = &this->seleMan1_;
  local_1c0 = &this->sele1_;
  SelectionManager::SelectionManager(local_1c8,info);
  this_00 = &this->evaluator1_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  local_1d0 = &this->sele2_;
  (this->sele2_)._M_dataplus._M_p = (pointer)&(this->sele2_).field_2;
  pcVar1 = (sele2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d0,pcVar1,pcVar1 + sele2->_M_string_length);
  local_1d8 = &this->seleMan2_;
  SelectionManager::SelectionManager(local_1d8,info);
  this_01 = &this->evaluator2_;
  SelectionEvaluator::SelectionEvaluator(this_01,info);
  (this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8 = &local_1a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b8,"Coordination Number Distribution","");
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).analysisType_);
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,local_1a8 + 1);
  }
  getPrefix(&local_210,filename);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_210);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_1a8 = *plVar5;
    lStack_1a0 = plVar3[3];
    local_1b8 = &local_1a8;
  }
  else {
    local_1a8 = *plVar5;
    local_1b8 = (long *)*plVar3;
  }
  local_1b0 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).outputFilename_);
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,local_1a8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  this->nnMax_ = 0xc;
  this->delta_ = 18.0 / (double)this->bins_;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," rcut = ",8);
  poVar4 = std::ostream::_M_insert<double>(this->rCut_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", nbins = ",10);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,this->bins_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", nnMax = ",10);
  std::ostream::operator<<((ostream *)poVar4,this->nnMax_);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).paramString_);
  SelectionEvaluator::loadScriptString(this_00,sele1);
  if ((this->evaluator1_).isDynamic_ == false) {
    SelectionEvaluator::evaluate(&local_1f0,this_00);
    lVar6 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan1_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar6),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&((local_1f0.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p + lVar6));
      lVar6 = lVar6 + 0x28;
    } while (lVar6 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_1f0.bitsets_);
    iVar2 = OpenMDBitSet::countBits
                      ((this->seleMan1_).ss_.bitsets_.
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    this->selectionCount1_ = iVar2;
  }
  SelectionEvaluator::loadScriptString(this_01,sele2);
  if ((this->evaluator2_).isDynamic_ == false) {
    SelectionEvaluator::evaluate(&local_1f0,this_01);
    lVar6 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan2_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar6),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&((local_1f0.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p + lVar6));
      lVar6 = lVar6 + 0x28;
    } while (lVar6 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_1f0.bitsets_);
    iVar2 = OpenMDBitSet::countBits
                      ((this->seleMan2_).ss_.bitsets_.
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    this->selectionCount2_ = iVar2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

CoordinationNumber::CoordinationNumber(SimInfo* info,
                                         const std::string& filename,
                                         const std::string& sele1,
                                         const std::string& sele2,
                                         RealType rCut, int bins) :
      StaticAnalyser(info, filename, bins),
      rCut_(rCut), bins_(bins), sele1_(sele1), seleMan1_(info),
      evaluator1_(info), sele2_(sele2), seleMan2_(info), evaluator2_(info) {
    setAnalysisType("Coordination Number Distribution");
    setOutputName(getPrefix(filename) + ".cn");

    nnMax_           = 12;
    RealType binMax_ = nnMax_ * 1.5;
    delta_           = binMax_ / bins_;

    std::stringstream params;
    params << " rcut = " << rCut_ << ", nbins = " << bins_
           << ", nnMax = " << nnMax_;
    const std::string paramString = params.str();
    setParameterString(paramString);

    evaluator1_.loadScriptString(sele1);
    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
      selectionCount1_ = seleMan1_.getSelectionCount();
    }
    evaluator2_.loadScriptString(sele2);
    if (!evaluator2_.isDynamic()) {
      seleMan2_.setSelectionSet(evaluator2_.evaluate());
      selectionCount2_ = seleMan2_.getSelectionCount();
    }
  }